

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

string_view __thiscall bloaty::ArgParser::Arg(ArgParser *this)

{
  char *__s;
  string_view sVar1;
  
  if (this->index_ != this->argc_) {
    __s = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[this->index_];
    sVar1._M_len = strlen(__s);
    sVar1._M_str = __s;
    return sVar1;
  }
  __assert_fail("!IsDone()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x7f0,"string_view bloaty::ArgParser::Arg()");
}

Assistant:

string_view Arg() {
    assert(!IsDone());
    return string_view(argv_[index_]);
  }